

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O2

void __thiscall
el::Configurations::setGlobally
          (Configurations *this,ConfigurationType configurationType,string *value,
          bool includeGlobalLevel)

{
  undefined7 in_register_00000009;
  EnumType lIndex;
  ConfigurationType configurationType_local;
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  
  configurationType_local = configurationType;
  if ((int)CONCAT71(in_register_00000009,includeGlobalLevel) != 0) {
    set(this,Global,configurationType,value);
  }
  lIndex = 2;
  local_28 = (code *)0x0;
  pcStack_20 = (code *)0x0;
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  local_38._M_unused._M_object = operator_new(0x20);
  *(Configurations **)local_38._M_unused._0_8_ = this;
  *(EnumType **)((long)local_38._M_unused._0_8_ + 8) = &lIndex;
  *(ConfigurationType **)((long)local_38._M_unused._0_8_ + 0x10) = &configurationType_local;
  *(string **)((long)local_38._M_unused._0_8_ + 0x18) = value;
  pcStack_20 = base::utils::std::
               _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NwnUtilLib/easylogging++.cc:485:38)>
               ::_M_invoke;
  local_28 = base::utils::std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NwnUtilLib/easylogging++.cc:485:38)>
             ::_M_manager;
  LevelHelper::forEachLevel(&lIndex,(function<bool_()> *)&local_38);
  base::utils::std::_Function_base::~_Function_base((_Function_base *)&local_38);
  return;
}

Assistant:

void Configurations::setGlobally(ConfigurationType configurationType, const std::string& value,
                                 bool includeGlobalLevel) {
  if (includeGlobalLevel) {
    set(Level::Global, configurationType, value);
  }
  base::type::EnumType lIndex = LevelHelper::kMinValid;
  LevelHelper::forEachLevel(&lIndex, [&](void) -> bool {
    set(LevelHelper::castFromInt(lIndex), configurationType, value);
    return false;  // Do not break lambda function yet as we need to set all levels regardless
  });
}